

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_attitude.c
# Opt level: O0

void fsnav_ins_attitude_rodrigues(void)

{
  double dVar1;
  double dVar2;
  double local_38;
  ulong local_30;
  size_t i;
  double a [3];
  double dt;
  
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      (fsnav->imu->sol).q_valid = '\0';
      (fsnav->imu->sol).L_valid = '\0';
      (fsnav->imu->sol).rpy_valid = '\0';
      fsnav_ins_attitude_rodrigues::L = (fsnav->imu->sol).L;
      local_30 = 1;
      (fsnav->imu->sol).q[0] = 1.0;
      for (; local_30 < 4; local_30 = local_30 + 1) {
        (fsnav->imu->sol).q[local_30] = 0.0;
      }
      (fsnav->imu->sol).q_valid = '\x01';
      for (local_30 = 0; local_30 < 9; local_30 = local_30 + 1) {
        fsnav_ins_attitude_rodrigues::L[local_30] = (double)((local_30 & 3) == 0);
      }
      (fsnav->imu->sol).L_valid = '\x01';
      (fsnav->imu->sol).rpy[0] = -(fsnav->imu_const).pi / 2.0;
      (fsnav->imu->sol).rpy[1] = 0.0;
      (fsnav->imu->sol).rpy[2] = (fsnav->imu_const).pi / 2.0;
      (fsnav->imu->sol).rpy_valid = '\x01';
      fsnav_ins_attitude_rodrigues::t0 = -1.0;
    }
    else if (((-1 < fsnav->mode) && ((fsnav->imu->sol).L_valid != '\0')) &&
            (fsnav->imu->w_valid != '\0')) {
      if (fsnav_ins_attitude_rodrigues::t0 < 0.0) {
        fsnav_ins_attitude_rodrigues::t0 = fsnav->imu->t;
      }
      else {
        a[2] = fsnav->imu->t - fsnav_ins_attitude_rodrigues::t0;
        fsnav_ins_attitude_rodrigues::t0 = fsnav->imu->t;
        for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
          a[local_30 - 1] = fsnav->imu->w[local_30] * a[2];
        }
        fsnav_linal_eul2mat(fsnav_ins_attitude_rodrigues::C,(double *)&i);
        for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
          i = (size_t)fsnav_ins_attitude_rodrigues::L[local_30];
          a[0] = fsnav_ins_attitude_rodrigues::L[local_30 + 3];
          a[1] = fsnav_ins_attitude_rodrigues::L[local_30 + 6];
          fsnav_ins_attitude_rodrigues::L[local_30] =
               fsnav_ins_attitude_rodrigues::C[2] * a[1] +
               fsnav_ins_attitude_rodrigues::C[0] * (double)i +
               fsnav_ins_attitude_rodrigues::C[1] * a[0];
          fsnav_ins_attitude_rodrigues::L[local_30 + 3] =
               fsnav_ins_attitude_rodrigues::C[5] * a[1] +
               fsnav_ins_attitude_rodrigues::C[3] * (double)i +
               fsnav_ins_attitude_rodrigues::C[4] * a[0];
          fsnav_ins_attitude_rodrigues::L[local_30 + 6] =
               fsnav_ins_attitude_rodrigues::C[8] * a[1] +
               fsnav_ins_attitude_rodrigues::C[6] * (double)i +
               fsnav_ins_attitude_rodrigues::C[7] * a[0];
        }
        for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
          if (fsnav->imu->W_valid == '\0') {
            local_38 = 0.0;
          }
          else {
            local_38 = fsnav->imu->W[local_30];
          }
          a[local_30 - 1] = local_38;
        }
        if ((fsnav->imu->sol).llh_valid != '\0') {
          dVar1 = (fsnav->imu_const).u;
          dVar2 = cos((fsnav->imu->sol).llh[1]);
          a[0] = dVar1 * dVar2 + a[0];
          dVar1 = (fsnav->imu_const).u;
          dVar2 = sin((fsnav->imu->sol).llh[1]);
          a[1] = dVar1 * dVar2 + a[1];
        }
        for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
          a[local_30 - 1] = a[2] * a[local_30 - 1];
        }
        fsnav_linal_eul2mat(fsnav_ins_attitude_rodrigues::C,(double *)&i);
        for (local_30 = 0; local_30 < 9; local_30 = local_30 + 3) {
          i = (size_t)fsnav_ins_attitude_rodrigues::L[local_30];
          a[0] = fsnav_ins_attitude_rodrigues::L[local_30 + 1];
          a[1] = fsnav_ins_attitude_rodrigues::L[local_30 + 2];
          fsnav_ins_attitude_rodrigues::L[local_30] =
               a[1] * fsnav_ins_attitude_rodrigues::C[2] +
               (double)i * fsnav_ins_attitude_rodrigues::C[0] +
               a[0] * fsnav_ins_attitude_rodrigues::C[1];
          fsnav_ins_attitude_rodrigues::L[local_30 + 1] =
               a[1] * fsnav_ins_attitude_rodrigues::C[5] +
               (double)i * fsnav_ins_attitude_rodrigues::C[3] +
               a[0] * fsnav_ins_attitude_rodrigues::C[4];
          fsnav_ins_attitude_rodrigues::L[local_30 + 2] =
               a[1] * fsnav_ins_attitude_rodrigues::C[8] +
               (double)i * fsnav_ins_attitude_rodrigues::C[6] +
               a[0] * fsnav_ins_attitude_rodrigues::C[7];
        }
        fsnav_linal_mat2quat((fsnav->imu->sol).q,fsnav_ins_attitude_rodrigues::L);
        (fsnav->imu->sol).q_valid = '\x01';
        fsnav_linal_mat2rpy((fsnav->imu->sol).rpy,fsnav_ins_attitude_rodrigues::L);
        (fsnav->imu->sol).rpy_valid = '\x01';
      }
    }
  }
  return;
}

Assistant:

void fsnav_ins_attitude_rodrigues(void) {

	static double t0 = -1; // previous time
	static double 		   
		 C[9],             // intermediate matrix
		*L;                // pointer to attitude matrix in solution

	double 
		   dt,	           // time step
		   a[3];           // Euler rotation vector
	size_t i;              // common index variable


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// drop validity flags
		fsnav->imu->sol.  q_valid = 0;
		fsnav->imu->sol.  L_valid = 0;
		fsnav->imu->sol.rpy_valid = 0;
		// set matrix pointer to imu->sol
		L = fsnav->imu->sol.L;	
		// identity quaternion
		for (i = 1, fsnav->imu->sol.q[0] = 1; i < 4; i++)
			fsnav->imu->sol.q[i] = 0;
		fsnav->imu->sol.  q_valid = 1;
		// identity attitude matrix
		for (i = 0; i < 9; i++)
			L[i] = ((i%4) == 0) ? 1 : 0; // for 3x3 matrix, each 4-th element is diagonal
		fsnav->imu->sol.  L_valid = 1;
		// attitude angles for identity matrix
		fsnav->imu->sol.rpy[0] = -fsnav->imu_const.pi/2;	// roll             -90 deg
		fsnav->imu->sol.rpy[1] =  0;						// pitch              0 deg
		fsnav->imu->sol.rpy[2] = +fsnav->imu_const.pi/2;	// yaw=true heading +90 deg
		fsnav->imu->sol.rpy_valid = 1;
		// reset previous time
		t0 = -1;

	}

	else if (fsnav->mode < 0) {	// termination
		// do nothing
	}
	else						// main cycle
	{
		// check for crucial data initialized
		if (!fsnav->imu->sol.L_valid || !fsnav->imu->w_valid)
			return;
		// time variables
		if (t0 < 0) { // first touch
			t0 = fsnav->imu->t;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;
		// a = w*dt
		for (i = 0; i < 3; i++)
			a[i] = fsnav->imu->w[i]*dt;
		// L = (E + [a x]*sin(a)/|a| + [a x]^2*(1-cos(a))/|a|^2)*L
		fsnav_linal_eul2mat(C,a);  // C <- A = E + [a x]*sin(a)/|a| + [a x]^2*(1-cos(a))/|a|^2
		for (i = 0; i < 3; i++) { // L = A*L
			a[0] = L[0+i], a[1] = L[3+i], a[2] = L[6+i];
			L[0+i] = C[0]*a[0] + C[1]*a[1] + C[2]*a[2];
			L[3+i] = C[3]*a[0] + C[4]*a[1] + C[5]*a[2];
			L[6+i] = C[6]*a[0] + C[7]*a[1] + C[8]*a[2];
		}
		// a <- c = (W + u)*dt
		for (i = 0; i < 3; i++)
			a[i] = fsnav->imu->W_valid ? fsnav->imu->W[i] : 0;
		if (fsnav->imu->sol.llh_valid) {
			a[1] += fsnav->imu_const.u*cos(fsnav->imu->sol.llh[1]);
			a[2] += fsnav->imu_const.u*sin(fsnav->imu->sol.llh[1]);
		}
		for (i = 0; i < 3; i++)
			a[i] *= dt;
		// L = L*(E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2)^T
		fsnav_linal_eul2mat(C,a);     // C = E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2
		for (i = 0; i < 9; i += 3) { // L = L*C^T
			a[0] = L[i+0], a[1] = L[i+1], a[2] = L[i+2];
			L[i+0] = a[0]*C[0] + a[1]*C[1] + a[2]*C[2];
			L[i+1] = a[0]*C[3] + a[1]*C[4] + a[2]*C[5];
			L[i+2] = a[0]*C[6] + a[1]*C[7] + a[2]*C[8];
		}
		// renew quaternion
		fsnav_linal_mat2quat(fsnav->imu->sol.q ,L);
		fsnav->imu->sol.q_valid   = 1;
		// renew angles
		fsnav_linal_mat2rpy(fsnav->imu->sol.rpy,L);
		fsnav->imu->sol.rpy_valid = 1;

	}

}